

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O3

int luaB_select(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  long lVar5;
  lua_Integer lVar6;
  
  iVar1 = lua_gettop(L);
  iVar2 = lua_type(L,1);
  if ((iVar2 == 4) && (pcVar3 = lua_tolstring(L,1,(size_t *)0x0), *pcVar3 == '#')) {
    lua_pushinteger(L,(long)(iVar1 + -1));
    return 1;
  }
  lVar4 = luaL_checkinteger(L,1);
  lVar5 = (long)iVar1;
  lVar6 = lVar5;
  if (lVar4 < lVar5) {
    lVar6 = lVar4;
  }
  if (lVar4 < 0) {
    lVar6 = lVar4 + lVar5;
  }
  if (lVar6 < 1) {
    luaL_argerror(L,1,"index out of range");
  }
  return iVar1 - (int)lVar6;
}

Assistant:

static int luaB_select (lua_State *L) {
  int n = lua_gettop(L);
  if (lua_type(L, 1) == LUA_TSTRING && *lua_tostring(L, 1) == '#') {
    lua_pushinteger(L, n-1);
    return 1;
  }
  else {
    lua_Integer i = luaL_checkinteger(L, 1);
    if (i < 0) i = n + i;
    else if (i > n) i = n;
    luaL_argcheck(L, 1 <= i, 1, "index out of range");
    return n - (int)i;
  }
}